

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

int __thiscall notch::core::FullyConnectedLayer::init(FullyConnectedLayer *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  long in_RDX;
  
  if (*(long *)(in_RDX + 0x10) != 0) {
    (**(code **)(in_RDX + 0x18))();
    if (*(long *)(in_RDX + 0x10) != 0) {
      iVar1 = (**(code **)(in_RDX + 0x18))();
      return iVar1;
    }
  }
  ::std::__throw_bad_function_call();
}

Assistant:

virtual void init(std::unique_ptr<RNG> &rng, WeightInit init) {
        init(rng, *weights, nInputs, nOutputs);
        init(rng, *bias, nInputs, nOutputs);
    }